

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask13_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  
  vpmovsxbd_avx2(ZEXT816(0x4c443830241c1008));
  auVar11 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(in[5] * 2)));
  auVar10 = auVar11._0_16_;
  auVar5 = vpsrlvd_avx2(auVar10,_DAT_0019b4f0);
  auVar9 = vpsrlvd_avx2(auVar10,_DAT_0019b500);
  auVar10 = vpinsrd_avx(auVar10,in[5] * 2,1);
  auVar10 = vpinsrd_avx(auVar10,in[10] << 2,3);
  auVar10 = vpor_avx(auVar10,auVar5);
  auVar4 = vpsllvd_avx2(auVar11,_DAT_00197e00);
  auVar10 = vpblendd_avx2(auVar9,auVar10,10);
  vpmovsxbd_avx2(ZEXT816(0x4840342c20180c04));
  auVar12 = valignd_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar10),7);
  auVar13 = vpgatherdd_avx512vl(*in);
  auVar13 = vpsllvd_avx2(auVar13,_DAT_00197dc0);
  auVar12 = vpblendd_avx2(auVar12,ZEXT432(*in),1);
  auVar14 = vpbroadcastd_avx512vl();
  uVar1 = in[0x14];
  auVar12 = vpblendd_avx2(auVar12,auVar14,0x20);
  auVar14 = vpbroadcastd_avx512vl();
  uVar2 = in[0x19];
  auVar12 = vpblendd_avx2(auVar12,auVar14,0x40);
  auVar14 = vpbroadcastd_avx512vl();
  uVar3 = in[0x1f];
  auVar12 = vpblendd_avx2(auVar12,auVar14,0x80);
  auVar12 = vpternlogd_avx512vl(auVar4,auVar13,auVar12,0xfe);
  vpmovsxbd_avx(ZEXT416(0x746c6058));
  *(undefined1 (*) [32])out = auVar12;
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)(uVar1 << 4)));
  auVar10 = vpalignr_avx(auVar8,auVar11._16_16_,0xc);
  auVar5 = vpshufd_avx(auVar8,0xa0);
  auVar9 = vpsrlvd_avx2(auVar10,_DAT_0019b530);
  auVar10 = vpinsrd_avx(auVar5,uVar1 << 4,0);
  auVar6 = vpsrlvd_avx2(auVar5,_DAT_0019b540);
  auVar10 = vpinsrd_avx(auVar10,uVar2 << 5,2);
  auVar10 = vpor_avx(auVar10,auVar9);
  auVar5 = vpsllvd_avx2(auVar8,_DAT_0019b5a0);
  auVar10 = vpblendd_avx2(auVar10,auVar6,10);
  vpmovsxbd_avx(ZEXT416(0x70685c54));
  uVar7 = uVar3 << 0x13 | in[0x1e] << 6 | auVar8._12_4_ >> 7;
  auVar9 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar7));
  auVar9 = vpsllvd_avx2(auVar9,_DAT_0019b580);
  auVar10 = vpternlogd_avx512vl(auVar5,auVar9,auVar10,0xfe);
  *(undefined1 (*) [16])(out + 8) = auVar10;
  out[0xc] = uVar7;
  return out + 0xd;
}

Assistant:

uint32_t *__fastpackwithoutmask13_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (13 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (13 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (13 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (13 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (13 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (13 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (13 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (13 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (13 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (13 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (13 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (13 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  ++in;

  return out;
}